

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O0

void __thiscall jrtplib::RTCPScheduler::CalculateNextRTCPTime(RTCPScheduler *this)

{
  RTPTime local_30;
  double local_28;
  RTPSourceData *local_20;
  RTPSourceData *srcdat;
  RTCPScheduler *pRStack_10;
  bool aresender;
  RTCPScheduler *this_local;
  
  srcdat._7_1_ = 0;
  pRStack_10 = this;
  local_20 = RTPSources::GetOwnSourceInfo(this->sources);
  if (local_20 != (RTPSourceData *)0x0) {
    srcdat._7_1_ = RTPSourceData::IsSender(local_20);
  }
  local_28 = (double)RTPTime::CurrentTime();
  (this->nextrtcptime).m_t = local_28;
  local_30 = CalculateTransmissionInterval(this,(bool)(srcdat._7_1_ & 1));
  RTPTime::operator+=(&this->nextrtcptime,&local_30);
  return;
}

Assistant:

void RTCPScheduler::CalculateNextRTCPTime()
{
	bool aresender = false;
	RTPSourceData *srcdat;
	
	if ((srcdat = sources.GetOwnSourceInfo()) != 0)
		aresender = srcdat->IsSender();
	
	nextrtcptime = RTPTime::CurrentTime();	
	nextrtcptime += CalculateTransmissionInterval(aresender);
}